

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group.cxx
# Opt level: O2

int __thiscall Fl_Group::handle(Fl_Group *this,int event)

{
  int iVar1;
  ssize_t sVar2;
  int iVar3;
  uint *puVar4;
  ulong uVar5;
  size_t in_RDX;
  size_t extraout_RDX;
  size_t __n;
  size_t __n_00;
  size_t __n_01;
  size_t __n_02;
  size_t __n_03;
  size_t sVar6;
  size_t __n_04;
  size_t __n_05;
  size_t extraout_RDX_00;
  size_t __n_06;
  long lVar7;
  int iVar8;
  Fl_Widget ***pppFVar9;
  uint uVar10;
  ulong uVar11;
  Fl_Widget *pFVar12;
  bool bVar13;
  undefined1 *puStack_50;
  Fl_Widget_Tracker wp;
  
  uVar10 = this->children_;
  uVar11 = (ulong)(int)uVar10;
  if ((long)uVar11 < 2) {
    pppFVar9 = &this->array_;
  }
  else {
    pppFVar9 = (Fl_Widget ***)this->array_;
  }
  puVar4 = &switchD_001ad195::switchdataD_00213a28;
  switch(event) {
  case 1:
    while (bVar13 = uVar11 != 0, uVar11 = uVar11 - 1, bVar13) {
      pFVar12 = (Fl_Widget *)pppFVar9[uVar11];
      if (((pFVar12->flags_ & 7) == 0) && (iVar1 = Fl::event_inside(pFVar12), iVar1 != 0)) {
        Fl_Widget_Tracker::Fl_Widget_Tracker(&wp,pFVar12);
        sVar2 = send((int)pFVar12,&DAT_00000001,__n_02,(int)puVar4);
        if ((int)sVar2 != 0) {
          if (((Fl::pushed_ != (Fl_Widget *)0x0) && (wp.wp_ != (Fl_Widget *)0x0)) &&
             (iVar1 = Fl_Widget::contains(pFVar12,Fl::pushed_), iVar1 == 0)) {
            Fl::pushed(pFVar12);
          }
          Fl_Widget_Tracker::~Fl_Widget_Tracker(&wp);
          return 1;
        }
        Fl_Widget_Tracker::~Fl_Widget_Tracker(&wp);
      }
    }
    break;
  case 2:
  case 5:
    if ((Fl_Group *)Fl::pushed_ != this) {
      if (Fl::pushed_ == (Fl_Widget *)0x0) {
        while (bVar13 = uVar11 != 0, uVar11 = uVar11 - 1, bVar13) {
          pFVar12 = (Fl_Widget *)pppFVar9[uVar11];
          if ((((pFVar12->flags_ & 7) == 0) && (iVar1 = Fl::event_inside(pFVar12), iVar1 != 0)) &&
             (sVar2 = send((int)pFVar12,(void *)(ulong)(uint)event,__n_06,(int)puVar4),
             (int)sVar2 != 0)) {
            return 1;
          }
        }
      }
      else {
        send((int)Fl::pushed_,(void *)(ulong)(uint)event,in_RDX,0x213a28);
      }
    }
    break;
  case 3:
  case 0xb:
    while( true ) {
      do {
        bVar13 = uVar11 == 0;
        uVar11 = uVar11 - 1;
        if (bVar13) {
          Fl::belowmouse(&this->super_Fl_Widget);
          return 1;
        }
        pFVar12 = (Fl_Widget *)pppFVar9[uVar11];
      } while (((pFVar12->flags_ & 2) != 0) || (iVar1 = Fl::event_inside(pFVar12), iVar1 == 0));
      iVar1 = Fl_Widget::contains(pFVar12,Fl::belowmouse_);
      iVar3 = (int)puVar4;
      if (iVar1 != 0) break;
      Fl::belowmouse(pFVar12);
      sVar2 = send((int)pFVar12,&DAT_00000003,__n,(int)puVar4);
      if ((int)sVar2 != 0) {
        return 1;
      }
    }
    puStack_50 = &DAT_0000000b;
    sVar6 = extraout_RDX;
    goto LAB_001ad609;
  default:
    iVar1 = 0;
    uVar5 = 0;
    if (0 < (int)uVar10) {
      uVar5 = (ulong)uVar10;
    }
    for (sVar6 = 0; uVar5 != sVar6; sVar6 = sVar6 + 1) {
      if (Fl::focus_ == (Fl_Widget *)pppFVar9[sVar6]) {
        iVar1 = (int)sVar6;
        break;
      }
    }
    iVar3 = iVar1;
    if (uVar10 != 0) {
      do {
        if ((((Fl_Widget *)pppFVar9[iVar3])->flags_ & 7) == 0) {
          sVar2 = send((int)(Fl_Widget *)pppFVar9[iVar3],(void *)(ulong)(uint)event,sVar6,(int)uVar5
                      );
          if ((int)sVar2 != 0) {
            return 1;
          }
          uVar11 = (ulong)(uint)this->children_;
          sVar6 = extraout_RDX_00;
        }
        iVar8 = iVar3 + 1;
        if ((int)uVar11 <= iVar3 + 1) {
          iVar8 = 0;
        }
        iVar3 = iVar8;
      } while (iVar8 != iVar1);
      return 0;
    }
    break;
  case 6:
    iVar1 = navkey();
    if (iVar1 - 0xff51U < 2) {
      do {
        bVar13 = uVar11 == 0;
        uVar11 = uVar11 - 1;
        if (bVar13) {
          return 0;
        }
        iVar1 = Fl_Widget::take_focus((Fl_Widget *)pppFVar9[uVar11]);
      } while (iVar1 == 0);
      return 1;
    }
    if ((1 < iVar1 - 0xff53U) && (this->savedfocus_ != (Fl_Widget *)0x0)) {
      iVar1 = Fl_Widget::take_focus(this->savedfocus_);
      if (iVar1 != 0) {
        return 1;
      }
      uVar10 = this->children_;
    }
    lVar7 = 0;
    while (uVar10 != (uint)lVar7) {
      iVar1 = Fl_Widget::take_focus((Fl_Widget *)pppFVar9[lVar7]);
      lVar7 = lVar7 + 1;
      if (iVar1 != 0) {
        return 1;
      }
    }
    break;
  case 7:
    this->savedfocus_ = fl_oldfocus;
    break;
  case 8:
    iVar1 = navkey();
    goto LAB_001ad550;
  case 0xc:
    while (bVar13 = uVar11 != 0, uVar11 = uVar11 - 1, bVar13) {
      pFVar12 = (Fl_Widget *)pppFVar9[uVar11];
      if ((((pFVar12->flags_ & 7) == 0) && (iVar1 = Fl::event_inside(pFVar12), iVar1 != 0)) &&
         (sVar2 = send((int)pFVar12,&DAT_0000000c,__n_03,(int)puVar4), (int)sVar2 != 0)) {
        return 1;
      }
    }
    lVar7 = (long)this->children_;
    while (bVar13 = lVar7 != 0, lVar7 = lVar7 + -1, bVar13) {
      pFVar12 = (Fl_Widget *)pppFVar9[lVar7];
      if ((((pFVar12->flags_ & 7) == 0) && (iVar1 = Fl::event_inside(pFVar12), iVar1 == 0)) &&
         (sVar2 = send((int)pFVar12,&DAT_0000000c,__n_05,(int)puVar4), (int)sVar2 != 0)) {
        return 1;
      }
    }
    if ((Fl::e_keysym | 0x80U) != 0xff8d) {
      return 0;
    }
    iVar1 = 0xff54;
LAB_001ad550:
    iVar1 = navigation(this,iVar1);
    return iVar1;
  case 0xd:
  case 0xe:
    for (lVar7 = 0; uVar10 != (uint)lVar7; lVar7 = lVar7 + 1) {
      pFVar12 = (Fl_Widget *)pppFVar9[lVar7];
      if ((pFVar12->flags_ & 1) == 0) {
        (*pFVar12->_vptr_Fl_Widget[3])(pFVar12,(ulong)(uint)event);
      }
    }
    return 1;
  case 0xf:
  case 0x10:
    for (lVar7 = 0; iVar1 = Fl::e_number, uVar10 != (uint)lVar7; lVar7 = lVar7 + 1) {
      pFVar12 = (Fl_Widget *)pppFVar9[lVar7];
      if ((event == 0xf) && (pFVar12 == Fl::focus_)) {
        Fl::e_number = 7;
        (*pFVar12->_vptr_Fl_Widget[3])(pFVar12,7);
        Fl::e_number = iVar1;
        Fl::focus((Fl_Widget *)0x0);
      }
      if ((pFVar12->flags_ & 2) == 0) {
        (*pFVar12->_vptr_Fl_Widget[3])(pFVar12,(ulong)(uint)event);
      }
    }
    return 1;
  case 0x13:
    do {
      bVar13 = uVar11 == 0;
      uVar11 = uVar11 - 1;
      if (bVar13) {
        lVar7 = (long)this->children_;
        do {
          bVar13 = lVar7 == 0;
          lVar7 = lVar7 + -1;
          if (bVar13) {
            return 0;
          }
          pFVar12 = (Fl_Widget *)pppFVar9[lVar7];
        } while ((((pFVar12->flags_ & 7) != 0) || (iVar1 = Fl::event_inside(pFVar12), iVar1 != 0))
                || (sVar2 = send((int)pFVar12,(void *)0x13,__n_04,(int)puVar4), (int)sVar2 == 0));
        return 1;
      }
      pFVar12 = (Fl_Widget *)pppFVar9[uVar11];
    } while ((((pFVar12->flags_ & 7) != 0) || (iVar1 = Fl::event_inside(pFVar12), iVar1 == 0)) ||
            (sVar2 = send((int)pFVar12,(void *)0x13,__n_01,(int)puVar4), (int)sVar2 == 0));
    return 1;
  case 0x14:
  case 0x15:
    while( true ) {
      do {
        bVar13 = uVar11 == 0;
        uVar11 = uVar11 - 1;
        if (bVar13) {
          Fl::belowmouse(&this->super_Fl_Widget);
          return 0;
        }
        pFVar12 = (Fl_Widget *)pppFVar9[uVar11];
      } while (((pFVar12->flags_ & 7) != 0) || (iVar1 = Fl::event_inside(pFVar12), iVar1 == 0));
      iVar1 = Fl_Widget::contains(pFVar12,Fl::belowmouse_);
      iVar3 = (int)puVar4;
      if (iVar1 != 0) break;
      sVar2 = send((int)pFVar12,&DAT_00000014,__n_00,iVar3);
      if ((int)sVar2 != 0) {
        iVar1 = Fl_Widget::contains(pFVar12,Fl::belowmouse_);
        if (iVar1 == 0) {
          Fl::belowmouse(pFVar12);
        }
        return 1;
      }
    }
    puStack_50 = &DAT_00000015;
    sVar6 = __n_00;
LAB_001ad609:
    sVar2 = send((int)pFVar12,puStack_50,sVar6,iVar3);
    return (int)sVar2;
  }
  return 0;
}

Assistant:

int Fl_Group::handle(int event) {

  Fl_Widget*const* a = array();
  int i;
  Fl_Widget* o;

  switch (event) {

  case FL_FOCUS:
    switch (navkey()) {
    default:
      if (savedfocus_ && savedfocus_->take_focus()) return 1;
    case FL_Right:
    case FL_Down:
      for (i = children(); i--;) if ((*a++)->take_focus()) return 1;
      break;
    case FL_Left:
    case FL_Up:
      for (i = children(); i--;) if (a[i]->take_focus()) return 1;
      break;
    }
    return 0;

  case FL_UNFOCUS:
    savedfocus_ = fl_oldfocus;
    return 0;

  case FL_KEYBOARD:
    return navigation(navkey());

  case FL_SHORTCUT:
    for (i = children(); i--;) {
      o = a[i];
      if (o->takesevents() && Fl::event_inside(o) && send(o,FL_SHORTCUT))
	return 1;
    }
    for (i = children(); i--;) {
      o = a[i];
      if (o->takesevents() && !Fl::event_inside(o) && send(o,FL_SHORTCUT))
	return 1;
    }
    if ((Fl::event_key() == FL_Enter || Fl::event_key() == FL_KP_Enter)) return navigation(FL_Down);
    return 0;

  case FL_ENTER:
  case FL_MOVE:
    for (i = children(); i--;) {
      o = a[i];
      if (o->visible() && Fl::event_inside(o)) {
	if (o->contains(Fl::belowmouse())) {
	  return send(o,FL_MOVE);
	} else {
	  Fl::belowmouse(o);
	  if (send(o,FL_ENTER)) return 1;
	}
      }
    }
    Fl::belowmouse(this);
    return 1;

  case FL_DND_ENTER:
  case FL_DND_DRAG:
    for (i = children(); i--;) {
      o = a[i];
      if (o->takesevents() && Fl::event_inside(o)) {
	if (o->contains(Fl::belowmouse())) {
	  return send(o,FL_DND_DRAG);
	} else if (send(o,FL_DND_ENTER)) {
	  if (!o->contains(Fl::belowmouse())) Fl::belowmouse(o);
	  return 1;
	}
      }
    }
    Fl::belowmouse(this);
    return 0;

  case FL_PUSH:
    for (i = children(); i--;) {
      o = a[i];
      if (o->takesevents() && Fl::event_inside(o)) {
	Fl_Widget_Tracker wp(o);
	if (send(o,FL_PUSH)) {
	  if (Fl::pushed() && wp.exists() && !o->contains(Fl::pushed())) Fl::pushed(o);
	  return 1;
	}
      }
    }
    return 0;

  case FL_RELEASE:
  case FL_DRAG:
    o = Fl::pushed();
    if (o == this) return 0;
    else if (o) send(o,event);
    else {
      for (i = children(); i--;) {
	o = a[i];
	if (o->takesevents() && Fl::event_inside(o)) {
	  if (send(o,event)) return 1;
	}
      }
    }
    return 0;

  case FL_MOUSEWHEEL:
    for (i = children(); i--;) {
      o = a[i];
      if (o->takesevents() && Fl::event_inside(o) && send(o,FL_MOUSEWHEEL))
	return 1;
    }
    for (i = children(); i--;) {
      o = a[i];
      if (o->takesevents() && !Fl::event_inside(o) && send(o,FL_MOUSEWHEEL))
	return 1;
    }
    return 0;

  case FL_DEACTIVATE:
  case FL_ACTIVATE:
    for (i = children(); i--;) {
      o = *a++;
      if (o->active()) o->handle(event);
    }
    return 1;

  case FL_SHOW:
  case FL_HIDE:
    for (i = children(); i--;) {
      o = *a++;
      if (event == FL_HIDE && o == Fl::focus()) {
        // Give up input focus...
	int old_event = Fl::e_number;
        o->handle(Fl::e_number = FL_UNFOCUS);
	Fl::e_number = old_event;
	Fl::focus(0);
      }
      if (o->visible()) o->handle(event);
    }
    return 1;

  default:
    // For all other events, try to give to each child, starting at focus:
    for (i = 0; i < children(); i ++)
      if (Fl::focus_ == a[i]) break;

    if (i >= children()) i = 0;

    if (children()) {
      for (int j = i;;) {
        if (a[j]->takesevents()) if (send(a[j], event)) return 1;
        j++;
        if (j >= children()) j = 0;
        if (j == i) break;
      }
    }

    return 0;
  }
}